

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O0

exr_result_t
exr_decoding_initialize
          (exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
          exr_decode_pipeline_t *decode)

{
  void *in_RCX;
  void *in_RDX;
  int in_ESI;
  char *in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_decode_pipeline_t nil;
  exr_result_t rv;
  undefined1 local_210 [16];
  _internal_exr_part *in_stack_fffffffffffffe00;
  _internal_exr_context *in_stack_fffffffffffffe08;
  exr_chunk_info_t *in_stack_fffffffffffffe10;
  exr_coding_channel_info_t *in_stack_fffffffffffffe18;
  int16_t *in_stack_fffffffffffffe20;
  exr_coding_channel_info_t **in_stack_fffffffffffffe28;
  exr_result_t local_4;
  
  memset(local_210,0,0x1e0);
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else if (*in_RDI == '\0') {
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else if ((in_RDX == (void *)0x0) || (in_RCX == (void *)0x0)) {
      local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,3);
    }
    else {
      memcpy(in_RCX,local_210,0x1e0);
      local_4 = internal_coding_fill_channel_info
                          (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                           in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                           in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      if (local_4 == 0) {
        *(int *)((long)in_RCX + 0xc) = in_ESI;
        *(char **)((long)in_RCX + 0x10) = in_RDI;
        memcpy((void *)((long)in_RCX + 0x18),in_RDX,0x40);
      }
    }
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,7);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_decoding_initialize (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_decode_pipeline_t*  decode)
{
    exr_result_t          rv;
    exr_decode_pipeline_t nil = {0};

    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!cinfo || !decode)
        return pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT);

    *decode = nil;

    rv = internal_coding_fill_channel_info (
        &(decode->channels),
        &(decode->channel_count),
        decode->_quick_chan_store,
        cinfo,
        pctxt,
        part);

    if (rv == EXR_ERR_SUCCESS)
    {
        decode->part_index = part_index;
        decode->context    = ctxt;
        decode->chunk      = *cinfo;
    }
    return rv;
}